

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,double,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>>
               (hugeint_t *ldata,double *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ValidityMask *mask_00;
  ulong uVar3;
  int64_t *piVar4;
  ulong uVar5;
  ValidityMask *pVVar6;
  void *pvVar7;
  ValidityMask *pVVar8;
  double dVar9;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar4 = &ldata->upper;
    pvVar7 = dataptr;
    for (pVVar6 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar6;
        pVVar6 = (ValidityMask *)
                 ((long)&(pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      input.upper = (int64_t)result_mask;
      input.lower = *piVar4;
      dVar9 = VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::
              Operation<duckdb::hugeint_t,double>
                        ((VectorDecimalCastOperator<duckdb::TryCastFromDecimal> *)
                         ((hugeint_t *)(piVar4 + -1))->lower,input,pVVar6,(idx_t)dataptr,pvVar7);
      result_data[(long)pVVar6] = dVar9;
      piVar4 = piVar4 + 2;
    }
  }
  else {
    pvVar7 = dataptr;
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    pVVar6 = (ValidityMask *)0x0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        pVVar8 = pVVar6 + 2;
        if (count <= pVVar6 + 2) {
          pVVar8 = (ValidityMask *)count;
        }
LAB_006f4cf6:
        piVar4 = &ldata[(long)pVVar6].upper;
        for (; mask_00 = pVVar6, pVVar6 < pVVar8;
            pVVar6 = (ValidityMask *)
                     ((long)&(pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
            ) {
          input_00.upper = (int64_t)result_mask;
          input_00.lower = *piVar4;
          dVar9 = VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::
                  Operation<duckdb::hugeint_t,double>
                            ((VectorDecimalCastOperator<duckdb::TryCastFromDecimal> *)
                             ((hugeint_t *)(piVar4 + -1))->lower,input_00,pVVar6,(idx_t)dataptr,
                             pvVar7);
          result_data[(long)pVVar6] = dVar9;
          piVar4 = piVar4 + 2;
        }
      }
      else {
        uVar2 = puVar1[uVar3];
        pVVar8 = pVVar6 + 2;
        if (count <= pVVar6 + 2) {
          pVVar8 = (ValidityMask *)count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_006f4cf6;
        mask_00 = pVVar8;
        if (uVar2 != 0) {
          piVar4 = &ldata[(long)pVVar6].upper;
          for (uVar5 = 0;
              mask_00 = (ValidityMask *)
                        ((long)&(pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                        uVar5), mask_00 < pVVar8; uVar5 = uVar5 + 1) {
            if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
              input_01.upper = (int64_t)result_mask;
              input_01.lower = *piVar4;
              dVar9 = VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::
                      Operation<duckdb::hugeint_t,double>
                                ((VectorDecimalCastOperator<duckdb::TryCastFromDecimal> *)
                                 ((hugeint_t *)(piVar4 + -1))->lower,input_01,mask_00,(idx_t)dataptr
                                 ,pvVar7);
              result_data
              [(long)&(pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_mask + uVar5] =
                   dVar9;
            }
            piVar4 = piVar4 + 2;
          }
        }
      }
      pVVar6 = mask_00;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}